

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInstancesProcess.cpp
# Opt level: O0

bool CompareBones(aiMesh *orig,aiMesh *inst)

{
  aiBone *paVar1;
  aiBone *paVar2;
  bool bVar3;
  uint local_3c;
  uint n;
  aiBone *oha;
  aiBone *aha;
  uint i;
  aiMesh *inst_local;
  aiMesh *orig_local;
  
  aha._4_4_ = 0;
  while( true ) {
    if (orig->mNumBones <= aha._4_4_) {
      return true;
    }
    paVar1 = orig->mBones[aha._4_4_];
    paVar2 = inst->mBones[aha._4_4_];
    if ((paVar1->mNumWeights != paVar2->mNumWeights) ||
       (bVar3 = aiMatrix4x4t<float>::operator!=(&paVar1->mOffsetMatrix,&paVar2->mOffsetMatrix),
       bVar3)) break;
    for (local_3c = 0; local_3c < paVar1->mNumWeights; local_3c = local_3c + 1) {
      if ((paVar1->mWeights[local_3c].mVertexId != paVar2->mWeights[local_3c].mVertexId) ||
         (paVar1->mWeights[local_3c].mWeight - paVar2->mWeights[local_3c].mWeight < 0.01)) {
        return false;
      }
    }
    aha._4_4_ = aha._4_4_ + 1;
  }
  return false;
}

Assistant:

bool CompareBones(const aiMesh* orig, const aiMesh* inst)
{
    for (unsigned int i = 0; i < orig->mNumBones;++i) {
        aiBone* aha = orig->mBones[i];
        aiBone* oha = inst->mBones[i];

        if (aha->mNumWeights   != oha->mNumWeights   ||
            aha->mOffsetMatrix != oha->mOffsetMatrix) {
            return false;
        }

        // compare weight per weight ---
        for (unsigned int n = 0; n < aha->mNumWeights;++n) {
            if  (aha->mWeights[n].mVertexId != oha->mWeights[n].mVertexId ||
                (aha->mWeights[n].mWeight - oha->mWeights[n].mWeight) < 10e-3f) {
                return false;
            }
        }
    }
    return true;
}